

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::setFds(OutgoingMessageImpl *this,Array<int> *fds)

{
  if (this->network->maxFdsPerMessage != 0) {
    kj::Array<int>::operator=(&this->fds,fds);
    return;
  }
  return;
}

Assistant:

void setFds(kj::Array<int> fds) override {
    if (network.maxFdsPerMessage > 0) {
      this->fds = kj::mv(fds);
    }
  }